

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateCols(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  pointer pDVar1;
  undefined8 uVar2;
  bool bVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Tolerances *pTVar5;
  Item *pIVar6;
  DataKey *pDVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 uVar12;
  Result RVar13;
  int iVar14;
  int iVar15;
  DuplicateColsPS *pDVar16;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar17;
  FixBoundsPS *pFVar18;
  SPxOut *pSVar19;
  long lVar20;
  long lVar21;
  pointer pDVar22;
  long lVar23;
  bool bVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  cpp_dec_float<200u,int,void> *pcVar30;
  int *piVar31;
  undefined4 *puVar32;
  pointer pnVar33;
  cpp_dec_float<200U,_int,_void> *pcVar34;
  cpp_dec_float<200U,_int,_void> *pcVar35;
  pointer pnVar36;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar37;
  int *piVar38;
  uint *puVar39;
  int *piVar40;
  cpp_dec_float<200U,_int,_void> *pcVar41;
  cpp_dec_float<200U,_int,_void> *pcVar42;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var43;
  DataArray<int> *pDVar44;
  ulong uVar45;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar46;
  bool bVar47;
  long lVar48;
  ulong uVar49;
  long in_FS_OFFSET;
  byte bVar50;
  Real RVar51;
  undefined1 auVar52 [16];
  double a;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  fpclass_type local_1128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10f0;
  int *idxMem;
  double local_10c8;
  undefined8 uStack_10c0;
  ulong local_10b8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> pClass;
  DataArray<bool> remCol;
  long local_1038;
  DataArray<int> classSize;
  DataArray<bool> fixAndRemCol;
  shared_ptr<soplex::Tolerances> local_ff8;
  shared_ptr<soplex::Tolerances> local_fe8;
  shared_ptr<soplex::Tolerances> local_fd8;
  shared_ptr<soplex::Tolerances> local_fc8;
  shared_ptr<soplex::Tolerances> local_fb8;
  shared_ptr<soplex::Tolerances> local_fa8;
  shared_ptr<soplex::Tolerances> local_f98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  DataArray<int> m_perm_empty;
  DataArray<int> da_perm;
  DataArray<int> local_e60;
  DataArray<int> local_e48;
  DataArray<int> local_e30;
  int *perm;
  int local_da8;
  bool local_da4;
  fpclass_type local_da0;
  int32_t iStack_d9c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined5 uStack_cb0;
  undefined3 uStack_cab;
  int iStack_ca8;
  undefined1 uStack_ca4;
  undefined8 local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined5 uStack_c30;
  undefined3 uStack_c2b;
  int iStack_c28;
  undefined1 uStack_c24;
  undefined8 local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined5 uStack_bb0;
  undefined3 uStack_bab;
  int iStack_ba8;
  undefined1 uStack_ba4;
  undefined8 local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined5 uStack_b30;
  undefined3 uStack_b2b;
  int iStack_b28;
  undefined1 uStack_b24;
  undefined8 local_b20;
  cpp_dec_float<200U,_int,_void> local_b18;
  cpp_dec_float<200u,int,void> local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [13];
  undefined3 uStack_a2b;
  int iStack_a28;
  undefined1 uStack_a24;
  undefined8 local_a20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a18;
  cpp_dec_float<200u,int,void> local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [13];
  undefined3 uStack_92b;
  int iStack_928;
  undefined1 uStack_924;
  undefined8 local_920;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_918;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_898;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_818;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_798;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_718;
  cpp_dec_float<200U,_int,_void> local_698;
  cpp_dec_float<200U,_int,_void> local_618;
  cpp_dec_float<200U,_int,_void> local_598;
  uint local_518 [28];
  int local_4a8 [28];
  int local_438 [28];
  int local_3c8 [28];
  int local_358 [28];
  int local_2e8 [28];
  uint local_278 [28];
  uint local_208 [28];
  uint local_198 [28];
  int local_128 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b8;
  
  bVar50 = 0;
  RVar13 = removeEmpty(this,lp);
  if (RVar13 == OKAY) {
    pClass.thesize =
         (lp->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum;
    RVar13 = OKAY;
    if (1 < pClass.thesize) {
      pClass.data = (int *)0x0;
      pClass.memFactor = 1.2;
      pClass.themax = pClass.thesize;
      spx_alloc<int*>(&pClass.data,pClass.thesize);
      iVar25 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      classSize.data = (int *)0x0;
      classSize.memFactor = 1.2;
      classSize.thesize = 0;
      if (0 < iVar25) {
        classSize.thesize = iVar25;
      }
      classSize.themax = 1;
      if (0 < iVar25) {
        classSize.themax = classSize.thesize;
      }
      spx_alloc<int*>(&classSize.data,classSize.themax);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      piVar38 = idxMem;
      *pClass.data = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      *classSize.data =
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
      iVar25 = 0;
      if (1 < (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar27 = 1;
        iVar25 = 0;
        lVar48 = 0x80;
        do {
          pClass.data[lVar27] = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)
                     ((long)((scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar48),0.0);
          classSize.data[lVar27] = 0;
          piVar38[lVar27 + -1] = (int)lVar27;
          lVar27 = lVar27 + 1;
          iVar25 = iVar25 + 1;
          lVar48 = lVar48 + 0x80;
        } while (lVar27 < (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      local_920._0_4_ = cpp_dec_float_finite;
      local_920._4_4_ = 0x1c;
      local_998[0] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[1] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[2] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[3] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[4] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[5] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[6] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[7] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[8] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[9] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[10] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[0xb] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[0xc] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[0xd] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[0xe] = (cpp_dec_float<200u,int,void>)0x0;
      local_998[0xf] = (cpp_dec_float<200u,int,void>)0x0;
      local_988 = (undefined1  [16])0x0;
      local_978 = (undefined1  [16])0x0;
      local_968 = (undefined1  [16])0x0;
      local_958 = (undefined1  [16])0x0;
      local_948 = (undefined1  [16])0x0;
      local_938 = SUB1613((undefined1  [16])0x0,0);
      uStack_92b = 0;
      iStack_928 = 0;
      uStack_924 = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_998,0.0);
      if (0 < (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar27 = 0;
        do {
          pIVar6 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem +
                   (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[lVar27].idx;
          if (0 < (pIVar6->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            lVar28 = 0;
            lVar48 = 0;
            do {
              pNVar4 = (pIVar6->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar39 = (uint *)((long)(pNVar4->val).m_backend.data._M_elems + lVar28);
              pcVar35 = &result_2.m_backend;
              for (lVar20 = 0x1c;
                  pnVar36 = scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start, lVar20 != 0;
                  lVar20 = lVar20 + -1) {
                (pcVar35->data)._M_elems[0] = *puVar39;
                puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar50 * -8 + 4)
                ;
              }
              result_2.m_backend.exp = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar28);
              result_2.m_backend.neg =
                   *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar28 + 4);
              result_2.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar28 + 8);
              iVar29 = *(int *)((long)(&((pIVar6->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar28);
              if (scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar29].m_backend.fpclass !=
                  cpp_dec_float_NaN) {
                result.m_backend.fpclass = cpp_dec_float_finite;
                result.m_backend.prec_elem = 0x1c;
                result.m_backend.data._M_elems[0] = 0;
                result.m_backend.data._M_elems[1] = 0;
                result.m_backend.data._M_elems[2] = 0;
                result.m_backend.data._M_elems[3] = 0;
                result.m_backend.data._M_elems[4] = 0;
                result.m_backend.data._M_elems[5] = 0;
                result.m_backend.data._M_elems[6] = 0;
                result.m_backend.data._M_elems[7] = 0;
                result.m_backend.data._M_elems[8] = 0;
                result.m_backend.data._M_elems[9] = 0;
                result.m_backend.data._M_elems[10] = 0;
                result.m_backend.data._M_elems[0xb] = 0;
                result.m_backend.data._M_elems[0xc] = 0;
                result.m_backend.data._M_elems[0xd] = 0;
                result.m_backend.data._M_elems[0xe] = 0;
                result.m_backend.data._M_elems[0xf] = 0;
                result.m_backend.data._M_elems[0x10] = 0;
                result.m_backend.data._M_elems[0x11] = 0;
                result.m_backend.data._M_elems[0x12] = 0;
                result.m_backend.data._M_elems[0x13] = 0;
                result.m_backend.data._M_elems[0x14] = 0;
                result.m_backend.data._M_elems[0x15] = 0;
                result.m_backend.data._M_elems[0x16] = 0;
                result.m_backend.data._M_elems[0x17] = 0;
                result.m_backend.data._M_elems[0x18] = 0;
                result.m_backend.data._M_elems[0x19] = 0;
                result.m_backend.data._M_elems._104_5_ = 0;
                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result.m_backend.exp = 0;
                result.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&result.m_backend,0.0);
                iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&pnVar36[iVar29].m_backend,&result.m_backend);
                if (iVar14 == 0) {
                  pcVar35 = &result_2.m_backend;
                  pnVar36 = scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar29;
                  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                    (pnVar36->m_backend).data._M_elems[0] = (pcVar35->data)._M_elems[0];
                    pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                    pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar50 * -2 + 1) * 4);
                  }
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar29].m_backend.exp =
                       result_2.m_backend.exp;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar29].m_backend.neg =
                       result_2.m_backend.neg;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar29].m_backend.fpclass =
                       result_2.m_backend.fpclass;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar29].m_backend.prec_elem =
                       result_2.m_backend.prec_elem;
                }
              }
              iVar14 = pClass.data[iVar29];
              pDVar22 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,&result_2.m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar29].m_backend);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(pDVar22 + iVar14,iVar29,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&result.m_backend);
              piVar31 = classSize.data + pClass.data[iVar29];
              *piVar31 = *piVar31 + -1;
              if (*piVar31 == 0) {
                lVar20 = (long)iVar25;
                iVar25 = iVar25 + 1;
                piVar38[lVar20] = pClass.data[iVar29];
              }
              lVar48 = lVar48 + 1;
              lVar28 = lVar28 + 0x84;
            } while (lVar48 < (pIVar6->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused);
          }
          if (0 < (pIVar6->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            lVar48 = 0;
            do {
              iVar29 = pClass.data
                       [(pIVar6->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem[lVar48].idx];
              if (0 < (this->m_classSetCols).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar29].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused) {
                pTVar5 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var43 = (this->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                if (p_Var43 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var43->_M_use_count = p_Var43->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var43->_M_use_count = p_Var43->_M_use_count + 1;
                  }
                }
                RVar51 = Tolerances::epsilon(pTVar5);
                local_a20._0_4_ = cpp_dec_float_finite;
                local_a20._4_4_ = 0x1c;
                local_a98[0] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[1] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[2] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[3] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[4] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[5] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[6] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[7] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[8] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[9] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[10] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[0xb] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[0xc] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[0xd] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[0xe] = (cpp_dec_float<200u,int,void>)0x0;
                local_a98[0xf] = (cpp_dec_float<200u,int,void>)0x0;
                local_a88 = (undefined1  [16])0x0;
                local_a78 = (undefined1  [16])0x0;
                local_a68 = (undefined1  [16])0x0;
                local_a58 = (undefined1  [16])0x0;
                local_a48 = (undefined1  [16])0x0;
                local_a38 = SUB1613((undefined1  [16])0x0,0);
                uStack_a2b = 0;
                iStack_a28 = 0;
                uStack_a24 = 0;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          (local_a98,RVar51);
                local_b18.fpclass = cpp_dec_float_finite;
                local_b18.prec_elem = 0x1c;
                local_b18.neg = false;
                local_b18.exp = 0;
                pcVar30 = local_a98;
                pcVar35 = &local_b18;
                for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                  (pcVar35->data)._M_elems[0] = *(uint *)pcVar30;
                  pcVar30 = pcVar30 + (ulong)bVar50 * -8 + 4;
                  pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar35 + ((ulong)bVar50 * -2 + 1) * 4);
                }
                local_b18.exp = iStack_a28;
                local_b18.neg = (bool)uStack_a24;
                local_b18.fpclass = (fpclass_type)local_a20;
                local_b18.prec_elem = local_a20._4_4_;
                if (p_Var43 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var43);
                }
                pDVar22 = (this->m_classSetCols).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar14 = pDVar22[iVar29].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
                if (1 < iVar14) {
                  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                            (pDVar22[iVar29].
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem,iVar14,(ElementCompare *)&local_b18,0,true);
                }
                iVar14 = *piVar38;
                lVar28 = (long)iVar25;
                iVar25 = iVar25 + -1;
                *piVar38 = piVar38[lVar28 + -1];
                pDVar22 = (this->m_classSetCols).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < pDVar22[iVar29].
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused) {
                  pDVar1 = pDVar22 + iVar29;
                  lVar28 = 0;
                  lVar20 = 0;
                  do {
                    uVar17 = local_920;
                    uVar12 = uStack_924;
                    iVar15 = iStack_928;
                    if (lVar28 != 0) {
                      piVar31 = (int *)((long)(((pDVar1->
                                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).m_elem)->val).m_backend.data._M_elems + lVar28);
                      piVar40 = local_128;
                      for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                        *piVar40 = *piVar31;
                        piVar31 = piVar31 + (ulong)bVar50 * -2 + 1;
                        piVar40 = piVar40 + (ulong)bVar50 * -2 + 1;
                      }
                      pcVar30 = local_998;
                      puVar39 = local_198;
                      for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                        *puVar39 = *(uint *)pcVar30;
                        pcVar30 = pcVar30 + ((ulong)bVar50 * -2 + 1) * 4;
                        puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                      }
                      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_598,this);
                      piVar31 = local_128;
                      pDVar44 = &da_perm;
                      for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                        pDVar44->thesize = *piVar31;
                        piVar31 = piVar31 + (ulong)bVar50 * -2 + 1;
                        pDVar44 = (DataArray<int> *)((long)pDVar44 + (ulong)bVar50 * -8 + 4);
                      }
                      puVar39 = local_198;
                      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&perm;
                      for (lVar21 = 0x1c; uVar2 = local_920, lVar21 != 0; lVar21 = lVar21 + -1) {
                        (pnVar37->m_backend).data._M_elems[0] = *puVar39;
                        puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                      }
                      local_da8 = iVar15;
                      local_da4 = (bool)uVar12;
                      local_920._0_4_ = (fpclass_type)uVar17;
                      local_920._4_4_ = SUB84(uVar17,4);
                      local_da0 = (fpclass_type)local_920;
                      iStack_d9c = local_920._4_4_;
                      local_920 = uVar2;
                      relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                (&result_2,(soplex *)&da_perm,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&perm,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)0x0);
                      pnVar37 = &result_2;
                      pcVar35 = &result.m_backend;
                      for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                        (pcVar35->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
                        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                        pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                      }
                      result.m_backend.exp = result_2.m_backend.exp;
                      result.m_backend.neg = result_2.m_backend.neg;
                      result.m_backend.fpclass = result_2.m_backend.fpclass;
                      result.m_backend.prec_elem = result_2.m_backend.prec_elem;
                      if ((result_2.m_backend.neg == true) &&
                         (result.m_backend.data._M_elems[0] != 0 ||
                          result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                        result.m_backend.neg = false;
                      }
                      if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                          (local_598.fpclass != cpp_dec_float_NaN)) &&
                         (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   compare(&result.m_backend,&local_598), 0 < iVar15)) {
                        iVar14 = *piVar38;
                        lVar21 = (long)iVar25;
                        iVar25 = iVar25 + -1;
                        *piVar38 = piVar38[lVar21 + -1];
                      }
                    }
                    pNVar4 = (this->m_classSetCols).data.
                             super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar29].
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem;
                    pClass.data[*(int *)((long)(&pNVar4->val + 1) + lVar28)] = iVar14;
                    classSize.data[iVar14] = classSize.data[iVar14] + 1;
                    puVar32 = (undefined4 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar28);
                    pcVar30 = local_998;
                    for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                      *(undefined4 *)pcVar30 = *puVar32;
                      puVar32 = puVar32 + (ulong)bVar50 * -2 + 1;
                      pcVar30 = pcVar30 + ((ulong)bVar50 * -2 + 1) * 4;
                    }
                    iStack_928 = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar28);
                    uStack_924 = *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar28 + 4U);
                    local_920 = *(undefined8 *)
                                 ((long)(&(pNVar4->val).m_backend.data + 1) + lVar28 + 8U);
                    lVar20 = lVar20 + 1;
                    pDVar22 = (this->m_classSetCols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pDVar1 = pDVar22 + iVar29;
                    lVar28 = lVar28 + 0x84;
                  } while (lVar20 < (pDVar1->
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).memused);
                }
                pDVar22[iVar29].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused = 0;
              }
              lVar48 = lVar48 + 1;
            } while (lVar48 < (pIVar6->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused);
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < (lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      free(idxMem);
      idxMem = (int *)0x0;
      remCol.themax =
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
      remCol.data = (bool *)0x0;
      remCol.memFactor = 1.2;
      remCol.thesize = remCol.themax;
      if (remCol.themax < 1) {
        remCol.themax = 1;
        remCol.thesize = 0;
      }
      spx_alloc<bool*>(&remCol.data,remCol.themax);
      fixAndRemCol.themax =
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
      fixAndRemCol.data = (bool *)0x0;
      fixAndRemCol.memFactor = 1.2;
      fixAndRemCol.thesize = fixAndRemCol.themax;
      if (fixAndRemCol.themax < 1) {
        fixAndRemCol.themax = 1;
        fixAndRemCol.thesize = 0;
      }
      spx_alloc<bool*>(&fixAndRemCol.data,fixAndRemCol.themax);
      auVar11 = _DAT_00601040;
      iVar25 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (0 < (long)iVar25) {
        pDVar22 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar27 = (long)iVar25 + -1;
        auVar52._8_4_ = (int)lVar27;
        auVar52._0_8_ = lVar27;
        auVar52._12_4_ = (int)((ulong)lVar27 >> 0x20);
        lVar27 = 0;
        auVar52 = auVar52 ^ _DAT_00601040;
        auVar53 = _DAT_00601020;
        auVar54 = _DAT_00601030;
        do {
          auVar55 = auVar54 ^ auVar11;
          iVar29 = auVar52._4_4_;
          if ((bool)(~(auVar55._4_4_ == iVar29 && auVar52._0_4_ < auVar55._0_4_ ||
                      iVar29 < auVar55._4_4_) & 1)) {
            *(undefined4 *)
             ((long)&(pDVar22->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).memused + lVar27) = 0;
          }
          if ((auVar55._12_4_ != auVar52._12_4_ || auVar55._8_4_ <= auVar52._8_4_) &&
              auVar55._12_4_ <= auVar52._12_4_) {
            *(undefined4 *)
             ((long)&pDVar22[1].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar27) = 0;
          }
          auVar55 = auVar53 ^ auVar11;
          iVar14 = auVar55._4_4_;
          if (iVar14 <= iVar29 && (iVar14 != iVar29 || auVar55._0_4_ <= auVar52._0_4_)) {
            *(undefined4 *)
             ((long)&pDVar22[2].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar27) = 0;
            *(undefined4 *)
             ((long)&pDVar22[3].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar27) = 0;
          }
          lVar48 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + 4;
          auVar54._8_8_ = lVar48 + 4;
          lVar48 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + 4;
          auVar53._8_8_ = lVar48 + 4;
          lVar27 = lVar27 + 0x80;
        } while ((ulong)(iVar25 + 3U >> 2) << 7 != lVar27);
      }
      if (0 < (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar27 = 0;
        do {
          remCol.data[lVar27] = false;
          fixAndRemCol.data[lVar27] = false;
          iVar25 = pClass.data[lVar27];
          pDVar22 = (this->m_dupCols).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&result,0.0);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(pDVar22 + iVar25,(int)lVar27,&result);
          lVar27 = lVar27 + 1;
        } while (lVar27 < (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      m_perm_empty.data = (int *)0x0;
      m_perm_empty.memFactor = 1.2;
      m_perm_empty.thesize = 0;
      m_perm_empty.themax = 1;
      spx_alloc<int*>(&m_perm_empty.data,1);
      iVar25 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      bVar47 = 0 < iVar25;
      if (iVar25 < 1) {
        local_10b8 = 0;
      }
      else {
        this_00 = &this->m_hist;
        local_10c8 = *(double *)(in_FS_OFFSET + -8);
        uStack_10c0 = 0;
        a = -local_10c8;
        lVar27 = 0;
        local_10b8 = 0;
        do {
          pDVar22 = (this->m_dupCols).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((1 < pDVar22[lVar27].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused) &&
             ((lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem
              [(lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey
               [(pDVar22[lVar27].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->idx].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused != 1)) {
            if ((local_10b8 & 1) == 0) {
              pDVar16 = (DuplicateColsPS *)operator_new(0x2d0);
              local_a18.m_backend.fpclass = cpp_dec_float_finite;
              local_a18.m_backend.prec_elem = 0x1c;
              local_a18.m_backend.data._M_elems[0] = 0;
              local_a18.m_backend.data._M_elems[1] = 0;
              local_a18.m_backend.data._M_elems[2] = 0;
              local_a18.m_backend.data._M_elems[3] = 0;
              local_a18.m_backend.data._M_elems[4] = 0;
              local_a18.m_backend.data._M_elems[5] = 0;
              local_a18.m_backend.data._M_elems[6] = 0;
              local_a18.m_backend.data._M_elems[7] = 0;
              local_a18.m_backend.data._M_elems[8] = 0;
              local_a18.m_backend.data._M_elems[9] = 0;
              local_a18.m_backend.data._M_elems[10] = 0;
              local_a18.m_backend.data._M_elems[0xb] = 0;
              local_a18.m_backend.data._M_elems[0xc] = 0;
              local_a18.m_backend.data._M_elems[0xd] = 0;
              local_a18.m_backend.data._M_elems[0xe] = 0;
              local_a18.m_backend.data._M_elems[0xf] = 0;
              local_a18.m_backend.data._M_elems[0x10] = 0;
              local_a18.m_backend.data._M_elems[0x11] = 0;
              local_a18.m_backend.data._M_elems[0x12] = 0;
              local_a18.m_backend.data._M_elems[0x13] = 0;
              local_a18.m_backend.data._M_elems[0x14] = 0;
              local_a18.m_backend.data._M_elems[0x15] = 0;
              local_a18.m_backend.data._M_elems[0x16] = 0;
              local_a18.m_backend.data._M_elems[0x17] = 0;
              local_a18.m_backend.data._M_elems[0x18] = 0;
              local_a18.m_backend.data._M_elems[0x19] = 0;
              local_a18.m_backend.data._M_elems._104_5_ = 0;
              local_a18.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              local_a18.m_backend.exp = 0;
              local_a18.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_a18,1.0);
              DataArray<int>::DataArray(&local_e30,&m_perm_empty);
              local_f98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_f98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_f98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_f98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_f98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_f98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_f98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              DuplicateColsPS::DuplicateColsPS
                        (pDVar16,lp,0,0,&local_a18,&local_e30,&local_f98,true,false);
              result.m_backend.data._M_elems._0_8_ = pDVar16;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         (result.m_backend.data._M_elems + 2),pDVar16);
              if (local_f98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_f98.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_e30.data != (int *)0x0) {
                free(local_e30.data);
                local_e30.data = (int *)0x0;
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&this_00->data,(value_type *)&result);
              uVar17 = extraout_RAX;
              if (result.m_backend.data._M_elems._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           result.m_backend.data._M_elems._8_8_);
                uVar17 = extraout_RAX_00;
              }
              local_10b8 = CONCAT71((int7)((ulong)uVar17 >> 8),1);
            }
            iVar25 = (this->m_dupCols).data.
                     super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar27].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            bVar24 = 0 < iVar25;
            if (0 < iVar25) {
              local_1038 = 0;
              do {
                pDVar22 = (this->m_dupCols).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < pDVar22[lVar27].
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused) {
                  pDVar22 = pDVar22 + lVar27;
                  lVar28 = 0x80;
                  lVar48 = 0;
                  do {
                    if (local_1038 != lVar48) {
                      pNVar4 = (pDVar22->
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).m_elem;
                      iVar25 = pNVar4[local_1038].idx;
                      lVar20 = (long)iVar25;
                      if (remCol.data[lVar20] == false) {
                        iVar29 = *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar28);
                        lVar21 = (long)iVar29;
                        if (remCol.data[lVar21] == false) {
                          pnVar36 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).object.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pnVar33 = pnVar36 + lVar20;
                          puVar39 = local_208;
                          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                            *puVar39 = (pnVar33->m_backend).data._M_elems[0];
                            pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar50 * -2 + 1) * 4);
                            puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                          }
                          iVar14 = pnVar36[lVar20].m_backend.exp;
                          bVar3 = pnVar36[lVar20].m_backend.neg;
                          uVar17._0_4_ = pnVar36[lVar20].m_backend.fpclass;
                          uVar17._4_4_ = pnVar36[lVar20].m_backend.prec_elem;
                          pnVar33 = pnVar36 + lVar21;
                          pcVar35 = &local_b18;
                          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                            (pcVar35->data)._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
                            pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar50 * -2 + 1) * 4);
                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                          }
                          local_b18.exp = pnVar36[lVar21].m_backend.exp;
                          local_b18.neg = pnVar36[lVar21].m_backend.neg;
                          local_b18.fpclass = pnVar36[lVar21].m_backend.fpclass;
                          local_b18.prec_elem = pnVar36[lVar21].m_backend.prec_elem;
                          factor.m_backend.fpclass = cpp_dec_float_finite;
                          factor.m_backend.prec_elem = 0x1c;
                          factor.m_backend.data._M_elems[0] = 0;
                          factor.m_backend.data._M_elems[1] = 0;
                          factor.m_backend.data._M_elems[2] = 0;
                          factor.m_backend.data._M_elems[3] = 0;
                          factor.m_backend.data._M_elems[4] = 0;
                          factor.m_backend.data._M_elems[5] = 0;
                          factor.m_backend.data._M_elems[6] = 0;
                          factor.m_backend.data._M_elems[7] = 0;
                          factor.m_backend.data._M_elems[8] = 0;
                          factor.m_backend.data._M_elems[9] = 0;
                          factor.m_backend.data._M_elems[10] = 0;
                          factor.m_backend.data._M_elems[0xb] = 0;
                          factor.m_backend.data._M_elems[0xc] = 0;
                          factor.m_backend.data._M_elems[0xd] = 0;
                          factor.m_backend.data._M_elems[0xe] = 0;
                          factor.m_backend.data._M_elems[0xf] = 0;
                          factor.m_backend.data._M_elems[0x10] = 0;
                          factor.m_backend.data._M_elems[0x11] = 0;
                          factor.m_backend.data._M_elems[0x12] = 0;
                          factor.m_backend.data._M_elems[0x13] = 0;
                          factor.m_backend.data._M_elems[0x14] = 0;
                          factor.m_backend.data._M_elems[0x15] = 0;
                          factor.m_backend.data._M_elems[0x16] = 0;
                          factor.m_backend.data._M_elems[0x17] = 0;
                          factor.m_backend.data._M_elems[0x18] = 0;
                          factor.m_backend.data._M_elems[0x19] = 0;
                          factor.m_backend.data._M_elems._104_5_ = 0;
                          factor.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                          factor.m_backend.exp = 0;
                          factor.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                    (&factor.m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar21].m_backend);
                          pcVar34 = &scale.data.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
                          result_2.m_backend.fpclass = cpp_dec_float_finite;
                          result_2.m_backend.prec_elem = 0x1c;
                          result_2.m_backend.data._M_elems[0] = 0;
                          result_2.m_backend.data._M_elems[1] = 0;
                          result_2.m_backend.data._M_elems[2] = 0;
                          result_2.m_backend.data._M_elems[3] = 0;
                          result_2.m_backend.data._M_elems[4] = 0;
                          result_2.m_backend.data._M_elems[5] = 0;
                          result_2.m_backend.data._M_elems[6] = 0;
                          result_2.m_backend.data._M_elems[7] = 0;
                          result_2.m_backend.data._M_elems[8] = 0;
                          result_2.m_backend.data._M_elems[9] = 0;
                          result_2.m_backend.data._M_elems[10] = 0;
                          result_2.m_backend.data._M_elems[0xb] = 0;
                          result_2.m_backend.data._M_elems[0xc] = 0;
                          result_2.m_backend.data._M_elems[0xd] = 0;
                          result_2.m_backend.data._M_elems[0xe] = 0;
                          result_2.m_backend.data._M_elems[0xf] = 0;
                          result_2.m_backend.data._M_elems[0x10] = 0;
                          result_2.m_backend.data._M_elems[0x11] = 0;
                          result_2.m_backend.data._M_elems[0x12] = 0;
                          result_2.m_backend.data._M_elems[0x13] = 0;
                          result_2.m_backend.data._M_elems[0x14] = 0;
                          result_2.m_backend.data._M_elems[0x15] = 0;
                          result_2.m_backend.data._M_elems[0x16] = 0;
                          result_2.m_backend.data._M_elems[0x17] = 0;
                          result_2.m_backend.data._M_elems[0x18] = 0;
                          result_2.m_backend.data._M_elems[0x19] = 0;
                          result_2.m_backend.data._M_elems._104_5_ = 0;
                          result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                          result_2.m_backend.exp = 0;
                          result_2.m_backend.neg = false;
                          pcVar35 = &local_b18;
                          if (&result_2.m_backend != pcVar34) {
                            pcVar42 = &result_2.m_backend;
                            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                              (pcVar42->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                              pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                        ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                              pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                        ((long)pcVar42 + (ulong)bVar50 * -8 + 4);
                            }
                            result_2.m_backend.exp = local_b18.exp;
                            result_2.m_backend.neg = local_b18.neg;
                            result_2.m_backend.fpclass = local_b18.fpclass;
                            result_2.m_backend.prec_elem = local_b18.prec_elem;
                            pcVar35 = pcVar34;
                          }
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          operator*=(&result_2.m_backend,pcVar35);
                          result.m_backend.fpclass = cpp_dec_float_finite;
                          result.m_backend.prec_elem = 0x1c;
                          result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                          result.m_backend.data._M_elems[0x18] = 0;
                          result.m_backend.data._M_elems[0x19] = 0;
                          result.m_backend.data._M_elems._104_5_ = 0;
                          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                          result.m_backend.exp = 0;
                          result.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                    (&result.m_backend,&result_2.m_backend,
                                     &scale.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar21].m_backend);
                          result_4.m_backend.fpclass = cpp_dec_float_finite;
                          result_4.m_backend.prec_elem = 0x1c;
                          result_4.m_backend.neg = false;
                          result_4.m_backend.exp = 0;
                          puVar39 = local_208;
                          pcVar35 = &result_4.m_backend;
                          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                            (pcVar35->data)._M_elems[0] = *puVar39;
                            puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                          }
                          result_4.m_backend.exp = iVar14;
                          result_4.m_backend.neg = bVar3;
                          result_4.m_backend._120_8_ = uVar17;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          operator-=(&result_4.m_backend,&result.m_backend);
                          uVar17 = result_4.m_backend._120_8_;
                          bVar3 = result_4.m_backend.neg;
                          iVar14 = result_4.m_backend.exp;
                          pnVar37 = &result_4;
                          puVar39 = local_278;
                          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                            *puVar39 = (pnVar37->m_backend).data._M_elems[0];
                            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                            puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                          }
                          epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_618,this);
                          puVar39 = local_278;
                          pnVar37 = &result;
                          for (lVar23 = 0x1c; uVar2 = result_4.m_backend._120_8_, lVar23 != 0;
                              lVar23 = lVar23 + -1) {
                            (pnVar37->m_backend).data._M_elems[0] = *puVar39;
                            puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                          }
                          result.m_backend.exp = iVar14;
                          result.m_backend.neg = bVar3;
                          local_1128 = (fpclass_type)uVar17;
                          result_4.m_backend.fpclass = (fpclass_type)uVar17;
                          result_4.m_backend.prec_elem = SUB84(uVar17,4);
                          result.m_backend.fpclass = result_4.m_backend.fpclass;
                          result.m_backend.prec_elem = result_4.m_backend.prec_elem;
                          if ((bVar3 != false) &&
                             (result.m_backend.data._M_elems[0] != 0 ||
                              local_1128 != cpp_dec_float_finite)) {
                            result.m_backend.neg = (bool)(bVar3 ^ 1);
                          }
                          result_4.m_backend._120_8_ = uVar2;
                          if ((local_1128 != cpp_dec_float_NaN) &&
                             (local_618.fpclass != cpp_dec_float_NaN)) {
                            iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>
                                     ::compare(&result.m_backend,&local_618);
                            if (iVar14 < 1) {
                              pnVar36 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar20;
                              piVar38 = local_2e8;
                              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                *piVar38 = *(int *)&(pnVar36->m_backend).data;
                                pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar50 * -2 + 1) * 4);
                                piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                              }
                              local_b20._0_4_ = cpp_dec_float_finite;
                              local_b20._4_4_ = 0x1c;
                              local_b98 = 0;
                              uStack_b90 = 0;
                              local_b88 = 0;
                              uStack_b80 = 0;
                              local_b78 = 0;
                              uStack_b70 = 0;
                              local_b68 = 0;
                              uStack_b60 = 0;
                              local_b58 = 0;
                              uStack_b50 = 0;
                              local_b48 = 0;
                              uStack_b40 = 0;
                              local_b38 = 0;
                              uStack_b30 = 0;
                              uStack_b2b = 0;
                              iStack_b28 = 0;
                              uStack_b24 = 0;
                              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                              operator=((cpp_dec_float<200u,int,void> *)&local_b98,0.0);
                              pTVar5 = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              p_Var43 = (this->
                                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        )._tolerances.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                              if (p_Var43 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  p_Var43->_M_use_count = p_Var43->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  p_Var43->_M_use_count = p_Var43->_M_use_count + 1;
                                }
                              }
                              RVar51 = Tolerances::epsilon(pTVar5);
                              piVar38 = local_2e8;
                              pDVar44 = &da_perm;
                              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                pDVar44->thesize = *piVar38;
                                piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                                pDVar44 = (DataArray<int> *)((long)pDVar44 + (ulong)bVar50 * -8 + 4)
                                ;
                              }
                              puVar39 = (uint *)&local_b98;
                              pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&perm;
                              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                (pnVar37->m_backend).data._M_elems[0] = *puVar39;
                                puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                                pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                              }
                              local_da8 = iStack_b28;
                              local_da4 = (bool)uStack_b24;
                              local_da0 = (fpclass_type)local_b20;
                              iStack_d9c = local_b20._4_4_;
                              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                        (&result_2,(soplex *)&da_perm,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&perm,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x0);
                              bVar3 = false;
                              if ((!NAN(RVar51)) &&
                                 (bVar3 = false, result_2.m_backend.fpclass != cpp_dec_float_NaN)) {
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,RVar51);
                                iVar14 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&result_2.m_backend,&result.m_backend);
                                bVar3 = iVar14 < 1;
                              }
                              bVar9 = true;
                              if (bVar3) {
                                pnVar36 = (lp->
                                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).up.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar20;
                                piVar38 = local_358;
                                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                  *piVar38 = *(int *)&(pnVar36->m_backend).data;
                                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar50 * -2 + 1) * 4);
                                  piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                                }
                                local_ba0._0_4_ = cpp_dec_float_finite;
                                local_ba0._4_4_ = 0x1c;
                                local_c18 = 0;
                                uStack_c10 = 0;
                                local_c08 = 0;
                                uStack_c00 = 0;
                                local_bf8 = 0;
                                uStack_bf0 = 0;
                                local_be8 = 0;
                                uStack_be0 = 0;
                                local_bd8 = 0;
                                uStack_bd0 = 0;
                                local_bc8 = 0;
                                uStack_bc0 = 0;
                                local_bb8 = 0;
                                uStack_bb0 = 0;
                                uStack_bab = 0;
                                iStack_ba8 = 0;
                                uStack_ba4 = 0;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&local_c18,0.0);
                                pTVar5 = (this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_10f0 = (this->
                                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi;
                                if (local_10f0 !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    local_10f0->_M_use_count = local_10f0->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    local_10f0->_M_use_count = local_10f0->_M_use_count + 1;
                                  }
                                }
                                RVar51 = Tolerances::epsilon(pTVar5);
                                piVar38 = local_358;
                                pDVar44 = &da_perm;
                                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                  pDVar44->thesize = *piVar38;
                                  piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                                  pDVar44 = (DataArray<int> *)
                                            ((long)pDVar44 + (ulong)bVar50 * -8 + 4);
                                }
                                puVar39 = (uint *)&local_c18;
                                pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)&perm;
                                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                  (pnVar37->m_backend).data._M_elems[0] = *puVar39;
                                  puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                                  pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                                }
                                local_da8 = iStack_ba8;
                                local_da4 = (bool)uStack_ba4;
                                local_da0 = (fpclass_type)local_ba0;
                                iStack_d9c = local_ba0._4_4_;
                                relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                          (&result_2,(soplex *)&da_perm,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&perm,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x0);
                                if ((NAN(RVar51)) ||
                                   (result_2.m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_0056acc1:
                                  bVar10 = true;
                                }
                                else {
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result,-RVar51);
                                  iVar14 = boost::multiprecision::backends::
                                           cpp_dec_float<200U,_int,_void>::compare
                                                     (&result_2.m_backend,&result.m_backend);
                                  if (iVar14 < 1) goto LAB_0056acc1;
                                  pnVar36 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).low.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar21;
                                  piVar38 = local_3c8;
                                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                    *piVar38 = *(int *)&(pnVar36->m_backend).data;
                                    pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar50 * -2 + 1) * 4
                                                       );
                                    piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                                  }
                                  local_c20._0_4_ = cpp_dec_float_finite;
                                  local_c20._4_4_ = 0x1c;
                                  local_c98 = 0;
                                  uStack_c90 = 0;
                                  local_c88 = 0;
                                  uStack_c80 = 0;
                                  local_c78 = 0;
                                  uStack_c70 = 0;
                                  local_c68 = 0;
                                  uStack_c60 = 0;
                                  local_c58 = 0;
                                  uStack_c50 = 0;
                                  local_c48 = 0;
                                  uStack_c40 = 0;
                                  local_c38 = 0;
                                  uStack_c30 = 0;
                                  uStack_c2b = 0;
                                  iStack_c28 = 0;
                                  uStack_c24 = 0;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&local_c98,0.0);
                                  pTVar5 = (this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr;
                                  local_10f8 = (this->
                                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               )._tolerances.
                                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi;
                                  if (local_10f8 !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      local_10f8->_M_use_count = local_10f8->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      local_10f8->_M_use_count = local_10f8->_M_use_count + 1;
                                    }
                                  }
                                  RVar51 = Tolerances::epsilon(pTVar5);
                                  piVar38 = local_3c8;
                                  pDVar44 = &da_perm;
                                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                    pDVar44->thesize = *piVar38;
                                    piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                                    pDVar44 = (DataArray<int> *)
                                              ((long)pDVar44 + (ulong)bVar50 * -8 + 4);
                                  }
                                  puVar39 = (uint *)&local_c98;
                                  pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)&perm;
                                  for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                    (pnVar37->m_backend).data._M_elems[0] = *puVar39;
                                    puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                                    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                                  }
                                  local_da8 = iStack_c28;
                                  local_da4 = (bool)uStack_c24;
                                  local_da0 = (fpclass_type)local_c20;
                                  iStack_d9c = local_c20._4_4_;
                                  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                            (&result_2,(soplex *)&da_perm,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&perm,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x0);
                                  if ((!NAN(RVar51)) &&
                                     (result_2.m_backend.fpclass != cpp_dec_float_NaN)) {
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result,RVar51);
                                    iVar14 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (&result_2.m_backend,&result.m_backend);
                                    if (iVar14 < 1) {
                                      pnVar36 = (lp->
                                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).up.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar21;
                                      piVar38 = local_438;
                                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                        *piVar38 = *(int *)&(pnVar36->m_backend).data;
                                        pnVar36 = (pointer)((long)pnVar36 +
                                                           ((ulong)bVar50 * -2 + 1) * 4);
                                        piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                                      }
                                      local_ca0._0_4_ = cpp_dec_float_finite;
                                      local_ca0._4_4_ = 0x1c;
                                      local_d18 = 0;
                                      uStack_d10 = 0;
                                      local_d08 = 0;
                                      uStack_d00 = 0;
                                      local_cf8 = 0;
                                      uStack_cf0 = 0;
                                      local_ce8 = 0;
                                      uStack_ce0 = 0;
                                      local_cd8 = 0;
                                      uStack_cd0 = 0;
                                      local_cc8 = 0;
                                      uStack_cc0 = 0;
                                      local_cb8 = 0;
                                      uStack_cb0 = 0;
                                      uStack_cab = 0;
                                      iStack_ca8 = 0;
                                      uStack_ca4 = 0;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&local_d18,0.0);
                                      pTVar5 = (this->
                                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               )._tolerances.
                                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr;
                                      local_1100 = (this->
                                                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  )._tolerances.
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                      if (local_1100 !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          local_1100->_M_use_count = local_1100->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          local_1100->_M_use_count = local_1100->_M_use_count + 1;
                                        }
                                      }
                                      RVar51 = Tolerances::epsilon(pTVar5);
                                      piVar38 = local_438;
                                      pDVar44 = &da_perm;
                                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                        pDVar44->thesize = *piVar38;
                                        piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                                        pDVar44 = (DataArray<int> *)
                                                  ((long)pDVar44 + (ulong)bVar50 * -8 + 4);
                                      }
                                      puVar39 = (uint *)&local_d18;
                                      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)&perm;
                                      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                        (pnVar37->m_backend).data._M_elems[0] = *puVar39;
                                        puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                                        pnVar37 = (
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                                      }
                                      local_da8 = iStack_ca8;
                                      local_da4 = (bool)uStack_ca4;
                                      local_da0 = (fpclass_type)local_ca0;
                                      iStack_d9c = local_ca0._4_4_;
                                      relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                                (&result_2,(soplex *)&da_perm,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&perm,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x0);
                                      bVar8 = false;
                                      if ((!NAN(RVar51)) &&
                                         (result_2.m_backend.fpclass != cpp_dec_float_NaN)) {
                                        result.m_backend.fpclass = cpp_dec_float_finite;
                                        result.m_backend.prec_elem = 0x1c;
                                        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems[0x18] = 0;
                                        result.m_backend.data._M_elems[0x19] = 0;
                                        result.m_backend.data._M_elems._104_5_ = 0;
                                        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                        result.m_backend.exp = 0;
                                        result.m_backend.neg = false;
                                        boost::multiprecision::backends::
                                        cpp_dec_float<200u,int,void>::operator=
                                                  ((cpp_dec_float<200u,int,void> *)&result,-RVar51);
                                        iVar14 = boost::multiprecision::backends::
                                                 cpp_dec_float<200U,_int,_void>::compare
                                                           (&result_2.m_backend,&result.m_backend);
                                        bVar8 = 0 < iVar14;
                                      }
                                      bVar10 = false;
                                      bVar9 = false;
                                      goto LAB_0056aea1;
                                    }
                                  }
                                  bVar10 = false;
                                }
                                bVar8 = false;
                                bVar9 = true;
                              }
                              else {
                                bVar8 = false;
                                bVar10 = true;
                              }
LAB_0056aea1:
                              if ((!bVar9) &&
                                 (local_1100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                 ) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_1100);
                              }
                              if (!bVar10 &&
                                  local_10f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                              {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_10f8);
                              }
                              if ((bool)(bVar3 & local_10f0 !=
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                        )) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_10f0);
                              }
                              if (p_Var43 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (p_Var43);
                              }
                              if (!bVar8) goto LAB_0056c374;
                              pDVar16 = (DuplicateColsPS *)operator_new(0x2d0);
                              pcVar35 = &factor.m_backend;
                              pnVar37 = &local_718;
                              for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                (pnVar37->m_backend).data._M_elems[0] = (pcVar35->data)._M_elems[0];
                                pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                          ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                                pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                              }
                              local_718.m_backend.exp = factor.m_backend.exp;
                              local_718.m_backend.neg = factor.m_backend.neg;
                              local_718.m_backend.fpclass = factor.m_backend.fpclass;
                              local_718.m_backend.prec_elem = factor.m_backend.prec_elem;
                              DataArray<int>::DataArray(&local_e48,&m_perm_empty);
                              local_fa8.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_fa8.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi =
                                   (this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                              if (local_fa8.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_fa8.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_fa8.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_fa8.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_fa8.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              DuplicateColsPS::DuplicateColsPS
                                        (pDVar16,lp,iVar25,iVar29,&local_718,&local_e48,&local_fa8,
                                         false,false);
                              da_perm._0_8_ = pDVar16;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data
                                         ,pDVar16);
                              if (local_fa8.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_fa8.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              if (local_e48.data != (int *)0x0) {
                                free(local_e48.data);
                                local_e48.data = (int *)0x0;
                              }
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&this_00->data,(value_type *)&da_perm);
                              if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0056b375:
                                if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar25 = boost::multiprecision::backends::
                                           cpp_dec_float<200U,_int,_void>::compare
                                                     (&factor.m_backend,&result.m_backend);
                                  if (iVar25 < 0) {
                                    pcVar35 = &(lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                    if (((pcVar35->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar25 = boost::multiprecision::backends::
                                                 cpp_dec_float<200U,_int,_void>::compare
                                                           (pcVar35,&result.m_backend), 0 < iVar25))
                                    {
                                      pcVar35 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).up.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 0x1c;
                                      result_2.m_backend.data._M_elems[0] = 0;
                                      result_2.m_backend.data._M_elems[1] = 0;
                                      result_2.m_backend.data._M_elems[2] = 0;
                                      result_2.m_backend.data._M_elems[3] = 0;
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems[6] = 0;
                                      result_2.m_backend.data._M_elems[7] = 0;
                                      result_2.m_backend.data._M_elems[8] = 0;
                                      result_2.m_backend.data._M_elems[9] = 0;
                                      result_2.m_backend.data._M_elems[10] = 0;
                                      result_2.m_backend.data._M_elems[0xb] = 0;
                                      result_2.m_backend.data._M_elems[0xc] = 0;
                                      result_2.m_backend.data._M_elems[0xd] = 0;
                                      result_2.m_backend.data._M_elems[0xe] = 0;
                                      result_2.m_backend.data._M_elems[0xf] = 0;
                                      result_2.m_backend.data._M_elems[0x10] = 0;
                                      result_2.m_backend.data._M_elems[0x11] = 0;
                                      result_2.m_backend.data._M_elems[0x12] = 0;
                                      result_2.m_backend.data._M_elems[0x13] = 0;
                                      result_2.m_backend.data._M_elems[0x14] = 0;
                                      result_2.m_backend.data._M_elems[0x15] = 0;
                                      result_2.m_backend.data._M_elems[0x16] = 0;
                                      result_2.m_backend.data._M_elems[0x17] = 0;
                                      result_2.m_backend.data._M_elems[0x18] = 0;
                                      result_2.m_backend.data._M_elems[0x19] = 0;
                                      result_2.m_backend.data._M_elems._104_5_ = 0;
                                      result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&result_2,
                                                  local_10c8);
                                      if (((pcVar35->fpclass != cpp_dec_float_NaN) &&
                                          (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                         (iVar25 = boost::multiprecision::backends::
                                                   cpp_dec_float<200U,_int,_void>::compare
                                                             (pcVar35,&result_2.m_backend),
                                         -1 < iVar25)) goto LAB_0056b515;
                                      pcVar42 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                                 m_backend;
                                      pcVar34 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).up.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                 m_backend;
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 0x1c;
                                      result_2.m_backend.data._M_elems[0] = 0;
                                      result_2.m_backend.data._M_elems[1] = 0;
                                      result_2.m_backend.data._M_elems[2] = 0;
                                      result_2.m_backend.data._M_elems[3] = 0;
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems[6] = 0;
                                      result_2.m_backend.data._M_elems[7] = 0;
                                      result_2.m_backend.data._M_elems[8] = 0;
                                      result_2.m_backend.data._M_elems[9] = 0;
                                      result_2.m_backend.data._M_elems[10] = 0;
                                      result_2.m_backend.data._M_elems[0xb] = 0;
                                      result_2.m_backend.data._M_elems[0xc] = 0;
                                      result_2.m_backend.data._M_elems[0xd] = 0;
                                      result_2.m_backend.data._M_elems[0xe] = 0;
                                      result_2.m_backend.data._M_elems[0xf] = 0;
                                      result_2.m_backend.data._M_elems[0x10] = 0;
                                      result_2.m_backend.data._M_elems[0x11] = 0;
                                      result_2.m_backend.data._M_elems[0x12] = 0;
                                      result_2.m_backend.data._M_elems[0x13] = 0;
                                      result_2.m_backend.data._M_elems[0x14] = 0;
                                      result_2.m_backend.data._M_elems[0x15] = 0;
                                      result_2.m_backend.data._M_elems[0x16] = 0;
                                      result_2.m_backend.data._M_elems[0x17] = 0;
                                      result_2.m_backend.data._M_elems[0x18] = 0;
                                      result_2.m_backend.data._M_elems[0x19] = 0;
                                      result_2.m_backend.data._M_elems._104_5_ = 0;
                                      result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      pcVar35 = &factor.m_backend;
                                      if (&result_2.m_backend != pcVar34) {
                                        pcVar41 = &result_2.m_backend;
                                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                          (pcVar41->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                                          pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                                    ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                                          pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                                                    ((long)pcVar41 + (ulong)bVar50 * -8 + 4);
                                        }
                                        result_2.m_backend.exp = factor.m_backend.exp;
                                        result_2.m_backend.neg = factor.m_backend.neg;
                                        result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                        result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                        pcVar35 = pcVar34;
                                      }
                                      boost::multiprecision::backends::
                                      cpp_dec_float<200U,_int,_void>::operator*=
                                                (&result_2.m_backend,pcVar35);
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 0x1c;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[0x18] = 0;
                                      result.m_backend.data._M_elems[0x19] = 0;
                                      result.m_backend.data._M_elems._104_5_ = 0;
                                      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      if (&result.m_backend != pcVar42) {
                                        pcVar35 = pcVar42;
                                        pcVar34 = &result.m_backend;
                                        for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                          (pcVar34->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                                          pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                                    ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                                          pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                    ((long)pcVar34 + (ulong)bVar50 * -8 + 4);
                                        }
                                        result.m_backend.exp = pcVar42->exp;
                                        result.m_backend.neg = pcVar42->neg;
                                        result.m_backend.fpclass = pcVar42->fpclass;
                                        result.m_backend.prec_elem = pcVar42->prec_elem;
                                      }
                                      boost::multiprecision::backends::
                                      cpp_dec_float<200U,_int,_void>::operator+=
                                                (&result.m_backend,&result_2.m_backend);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2a])(lp,lVar21,&result,0);
                                    }
                                    else {
LAB_0056b515:
                                      ::soplex::infinity::__tls_init();
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 0x1c;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[0x18] = 0;
                                      result.m_backend.data._M_elems[0x19] = 0;
                                      result.m_backend.data._M_elems._104_5_ = 0;
                                      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2a])
                                                (lp,lVar21,(cpp_dec_float<200u,int,void> *)&result,0
                                                );
                                    }
                                    pcVar35 = &(lp->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).up.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                               m_backend;
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result,local_10c8);
                                    if (((pcVar35->fpclass == cpp_dec_float_NaN) ||
                                        (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                       (iVar25 = boost::multiprecision::backends::
                                                 cpp_dec_float<200U,_int,_void>::compare
                                                           (pcVar35,&result.m_backend), iVar25 < 0))
                                    {
                                      pcVar35 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result_2.m_backend.fpclass = cpp_dec_float_finite;
                                      result_2.m_backend.prec_elem = 0x1c;
                                      result_2.m_backend.data._M_elems[0] = 0;
                                      result_2.m_backend.data._M_elems[1] = 0;
                                      result_2.m_backend.data._M_elems[2] = 0;
                                      result_2.m_backend.data._M_elems[3] = 0;
                                      result_2.m_backend.data._M_elems[4] = 0;
                                      result_2.m_backend.data._M_elems[5] = 0;
                                      result_2.m_backend.data._M_elems[6] = 0;
                                      result_2.m_backend.data._M_elems[7] = 0;
                                      result_2.m_backend.data._M_elems[8] = 0;
                                      result_2.m_backend.data._M_elems[9] = 0;
                                      result_2.m_backend.data._M_elems[10] = 0;
                                      result_2.m_backend.data._M_elems[0xb] = 0;
                                      result_2.m_backend.data._M_elems[0xc] = 0;
                                      result_2.m_backend.data._M_elems[0xd] = 0;
                                      result_2.m_backend.data._M_elems[0xe] = 0;
                                      result_2.m_backend.data._M_elems[0xf] = 0;
                                      result_2.m_backend.data._M_elems[0x10] = 0;
                                      result_2.m_backend.data._M_elems[0x11] = 0;
                                      result_2.m_backend.data._M_elems[0x12] = 0;
                                      result_2.m_backend.data._M_elems[0x13] = 0;
                                      result_2.m_backend.data._M_elems[0x14] = 0;
                                      result_2.m_backend.data._M_elems[0x15] = 0;
                                      result_2.m_backend.data._M_elems[0x16] = 0;
                                      result_2.m_backend.data._M_elems[0x17] = 0;
                                      result_2.m_backend.data._M_elems[0x18] = 0;
                                      result_2.m_backend.data._M_elems[0x19] = 0;
                                      result_2.m_backend.data._M_elems._104_5_ = 0;
                                      result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result_2.m_backend.exp = 0;
                                      result_2.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&result_2,a);
                                      if (((pcVar35->fpclass == cpp_dec_float_NaN) ||
                                          (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                         (iVar25 = boost::multiprecision::backends::
                                                   cpp_dec_float<200U,_int,_void>::compare
                                                             (pcVar35,&result_2.m_backend),
                                         0 < iVar25)) {
                                        pcVar34 = &(lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).up.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                                  m_backend;
                                        pcVar42 = &(lp->
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).low.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                  m_backend;
                                        result_2.m_backend.fpclass = cpp_dec_float_finite;
                                        result_2.m_backend.prec_elem = 0x1c;
                                        result_2.m_backend.data._M_elems[0] = 0;
                                        result_2.m_backend.data._M_elems[1] = 0;
                                        result_2.m_backend.data._M_elems[2] = 0;
                                        result_2.m_backend.data._M_elems[3] = 0;
                                        result_2.m_backend.data._M_elems[4] = 0;
                                        result_2.m_backend.data._M_elems[5] = 0;
                                        result_2.m_backend.data._M_elems[6] = 0;
                                        result_2.m_backend.data._M_elems[7] = 0;
                                        result_2.m_backend.data._M_elems[8] = 0;
                                        result_2.m_backend.data._M_elems[9] = 0;
                                        result_2.m_backend.data._M_elems[10] = 0;
                                        result_2.m_backend.data._M_elems[0xb] = 0;
                                        result_2.m_backend.data._M_elems[0xc] = 0;
                                        result_2.m_backend.data._M_elems[0xd] = 0;
                                        result_2.m_backend.data._M_elems[0xe] = 0;
                                        result_2.m_backend.data._M_elems[0xf] = 0;
                                        result_2.m_backend.data._M_elems[0x10] = 0;
                                        result_2.m_backend.data._M_elems[0x11] = 0;
                                        result_2.m_backend.data._M_elems[0x12] = 0;
                                        result_2.m_backend.data._M_elems[0x13] = 0;
                                        result_2.m_backend.data._M_elems[0x14] = 0;
                                        result_2.m_backend.data._M_elems[0x15] = 0;
                                        result_2.m_backend.data._M_elems[0x16] = 0;
                                        result_2.m_backend.data._M_elems[0x17] = 0;
                                        result_2.m_backend.data._M_elems[0x18] = 0;
                                        result_2.m_backend.data._M_elems[0x19] = 0;
                                        result_2.m_backend.data._M_elems._104_5_ = 0;
                                        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                        result_2.m_backend.exp = 0;
                                        result_2.m_backend.neg = false;
                                        pcVar35 = &factor.m_backend;
                                        if (&result_2.m_backend != pcVar42) {
                                          pcVar41 = &result_2.m_backend;
                                          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                            (pcVar41->data)._M_elems[0] =
                                                 (pcVar35->data)._M_elems[0];
                                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                                      ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                                            pcVar41 = (cpp_dec_float<200U,_int,_void> *)
                                                      ((long)pcVar41 + (ulong)bVar50 * -8 + 4);
                                          }
                                          result_2.m_backend.exp = factor.m_backend.exp;
                                          result_2.m_backend.neg = factor.m_backend.neg;
                                          result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                          result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                          pcVar35 = pcVar42;
                                        }
                                        boost::multiprecision::backends::
                                        cpp_dec_float<200U,_int,_void>::operator*=
                                                  (&result_2.m_backend,pcVar35);
                                        result.m_backend.fpclass = cpp_dec_float_finite;
                                        result.m_backend.prec_elem = 0x1c;
                                        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                        result.m_backend.data._M_elems[0x18] = 0;
                                        result.m_backend.data._M_elems[0x19] = 0;
                                        result.m_backend.data._M_elems._104_5_ = 0;
                                        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                        result.m_backend.exp = 0;
                                        result.m_backend.neg = false;
                                        if (&result.m_backend != pcVar34) {
                                          pcVar35 = pcVar34;
                                          pcVar42 = &result.m_backend;
                                          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                            (pcVar42->data)._M_elems[0] =
                                                 (pcVar35->data)._M_elems[0];
                                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                                      ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                                            pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                                      ((long)pcVar42 + (ulong)bVar50 * -8 + 4);
                                          }
                                          result.m_backend.exp = pcVar34->exp;
                                          result.m_backend.neg = pcVar34->neg;
                                          result.m_backend.fpclass = pcVar34->fpclass;
                                          result.m_backend.prec_elem = pcVar34->prec_elem;
                                        }
                                        boost::multiprecision::backends::
                                        cpp_dec_float<200U,_int,_void>::operator+=
                                                  (&result.m_backend,&result_2.m_backend);
                                        (*(lp->
                                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .
                                          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._vptr_ClassArray[0x2d])(lp,lVar21,&result,0);
                                        goto LAB_0056c04c;
                                      }
                                    }
                                    ::soplex::infinity::__tls_init();
                                    result.m_backend.fpclass = cpp_dec_float_finite;
                                    result.m_backend.prec_elem = 0x1c;
                                    result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                    result.m_backend.data._M_elems[0x18] = 0;
                                    result.m_backend.data._M_elems[0x19] = 0;
                                    result.m_backend.data._M_elems._104_5_ = 0;
                                    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                    result.m_backend.exp = 0;
                                    result.m_backend.neg = false;
                                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                    operator=((cpp_dec_float<200u,int,void> *)&result,local_10c8);
                                    (*(lp->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .
                                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._vptr_ClassArray[0x2d])
                                              (lp,lVar21,(cpp_dec_float<200u,int,void> *)&result,0);
                                  }
                                }
                              }
                              else {
                                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar25 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&factor.m_backend,&result.m_backend);
                                if (iVar25 < 1) goto LAB_0056b375;
                                pcVar35 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).low.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                if (((pcVar35->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar25 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (pcVar35,&result.m_backend), 0 < iVar25)) {
                                  pcVar35 = &(lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).low.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 0x1c;
                                  result_2.m_backend.data._M_elems[0] = 0;
                                  result_2.m_backend.data._M_elems[1] = 0;
                                  result_2.m_backend.data._M_elems[2] = 0;
                                  result_2.m_backend.data._M_elems[3] = 0;
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems[6] = 0;
                                  result_2.m_backend.data._M_elems[7] = 0;
                                  result_2.m_backend.data._M_elems[8] = 0;
                                  result_2.m_backend.data._M_elems[9] = 0;
                                  result_2.m_backend.data._M_elems[10] = 0;
                                  result_2.m_backend.data._M_elems[0xb] = 0;
                                  result_2.m_backend.data._M_elems[0xc] = 0;
                                  result_2.m_backend.data._M_elems[0xd] = 0;
                                  result_2.m_backend.data._M_elems[0xe] = 0;
                                  result_2.m_backend.data._M_elems[0xf] = 0;
                                  result_2.m_backend.data._M_elems[0x10] = 0;
                                  result_2.m_backend.data._M_elems[0x11] = 0;
                                  result_2.m_backend.data._M_elems[0x12] = 0;
                                  result_2.m_backend.data._M_elems[0x13] = 0;
                                  result_2.m_backend.data._M_elems[0x14] = 0;
                                  result_2.m_backend.data._M_elems[0x15] = 0;
                                  result_2.m_backend.data._M_elems[0x16] = 0;
                                  result_2.m_backend.data._M_elems[0x17] = 0;
                                  result_2.m_backend.data._M_elems[0x18] = 0;
                                  result_2.m_backend.data._M_elems[0x19] = 0;
                                  result_2.m_backend.data._M_elems._104_5_ = 0;
                                  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result_2,a);
                                  if (((pcVar35->fpclass != cpp_dec_float_NaN) &&
                                      (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                     (iVar25 = boost::multiprecision::backends::
                                               cpp_dec_float<200U,_int,_void>::compare
                                                         (pcVar35,&result_2.m_backend), iVar25 < 1))
                                  goto LAB_0056b5a2;
                                  pnVar36 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).low.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pcVar34 = &pnVar36[lVar20].m_backend;
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 0x1c;
                                  result_2.m_backend.data._M_elems[0] = 0;
                                  result_2.m_backend.data._M_elems[1] = 0;
                                  result_2.m_backend.data._M_elems[2] = 0;
                                  result_2.m_backend.data._M_elems[3] = 0;
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems[6] = 0;
                                  result_2.m_backend.data._M_elems[7] = 0;
                                  result_2.m_backend.data._M_elems[8] = 0;
                                  result_2.m_backend.data._M_elems[9] = 0;
                                  result_2.m_backend.data._M_elems[10] = 0;
                                  result_2.m_backend.data._M_elems[0xb] = 0;
                                  result_2.m_backend.data._M_elems[0xc] = 0;
                                  result_2.m_backend.data._M_elems[0xd] = 0;
                                  result_2.m_backend.data._M_elems[0xe] = 0;
                                  result_2.m_backend.data._M_elems[0xf] = 0;
                                  result_2.m_backend.data._M_elems[0x10] = 0;
                                  result_2.m_backend.data._M_elems[0x11] = 0;
                                  result_2.m_backend.data._M_elems[0x12] = 0;
                                  result_2.m_backend.data._M_elems[0x13] = 0;
                                  result_2.m_backend.data._M_elems[0x14] = 0;
                                  result_2.m_backend.data._M_elems[0x15] = 0;
                                  result_2.m_backend.data._M_elems[0x16] = 0;
                                  result_2.m_backend.data._M_elems[0x17] = 0;
                                  result_2.m_backend.data._M_elems[0x18] = 0;
                                  result_2.m_backend.data._M_elems[0x19] = 0;
                                  result_2.m_backend.data._M_elems._104_5_ = 0;
                                  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  pcVar35 = &factor.m_backend;
                                  if (&result_2.m_backend != pcVar34) {
                                    pcVar42 = &result_2.m_backend;
                                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                      (pcVar42->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                                      pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                                      pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar42 + (ulong)bVar50 * -8 + 4);
                                    }
                                    result_2.m_backend.exp = factor.m_backend.exp;
                                    result_2.m_backend.neg = factor.m_backend.neg;
                                    result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                    result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                    pcVar35 = pcVar34;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  operator*=(&result_2.m_backend,pcVar35);
                                  pcVar35 = &pnVar36[lVar21].m_backend;
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  if (&result.m_backend != pcVar35) {
                                    pcVar34 = pcVar35;
                                    pcVar42 = &result.m_backend;
                                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                      (pcVar42->data)._M_elems[0] = (pcVar34->data)._M_elems[0];
                                      pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar34 + (ulong)bVar50 * -8 + 4);
                                      pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar42 + (ulong)bVar50 * -8 + 4);
                                    }
                                    result.m_backend.exp = pcVar35->exp;
                                    result.m_backend.neg = pcVar35->neg;
                                    result.m_backend.fpclass = pcVar35->fpclass;
                                    result.m_backend.prec_elem = pcVar35->prec_elem;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  operator+=(&result.m_backend,&result_2.m_backend);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])(lp,lVar21,&result,0);
                                }
                                else {
LAB_0056b5a2:
                                  ::soplex::infinity::__tls_init();
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2a])
                                            (lp,lVar21,(cpp_dec_float<200u,int,void> *)&result,0);
                                }
                                pcVar35 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar21].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,local_10c8);
                                if (((pcVar35->fpclass == cpp_dec_float_NaN) ||
                                    (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                                   (iVar25 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (pcVar35,&result.m_backend), iVar25 < 0)) {
                                  pcVar35 = &(lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 0x1c;
                                  result_2.m_backend.data._M_elems[0] = 0;
                                  result_2.m_backend.data._M_elems[1] = 0;
                                  result_2.m_backend.data._M_elems[2] = 0;
                                  result_2.m_backend.data._M_elems[3] = 0;
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems[6] = 0;
                                  result_2.m_backend.data._M_elems[7] = 0;
                                  result_2.m_backend.data._M_elems[8] = 0;
                                  result_2.m_backend.data._M_elems[9] = 0;
                                  result_2.m_backend.data._M_elems[10] = 0;
                                  result_2.m_backend.data._M_elems[0xb] = 0;
                                  result_2.m_backend.data._M_elems[0xc] = 0;
                                  result_2.m_backend.data._M_elems[0xd] = 0;
                                  result_2.m_backend.data._M_elems[0xe] = 0;
                                  result_2.m_backend.data._M_elems[0xf] = 0;
                                  result_2.m_backend.data._M_elems[0x10] = 0;
                                  result_2.m_backend.data._M_elems[0x11] = 0;
                                  result_2.m_backend.data._M_elems[0x12] = 0;
                                  result_2.m_backend.data._M_elems[0x13] = 0;
                                  result_2.m_backend.data._M_elems[0x14] = 0;
                                  result_2.m_backend.data._M_elems[0x15] = 0;
                                  result_2.m_backend.data._M_elems[0x16] = 0;
                                  result_2.m_backend.data._M_elems[0x17] = 0;
                                  result_2.m_backend.data._M_elems[0x18] = 0;
                                  result_2.m_backend.data._M_elems[0x19] = 0;
                                  result_2.m_backend.data._M_elems._104_5_ = 0;
                                  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result_2,local_10c8);
                                  if (((pcVar35->fpclass != cpp_dec_float_NaN) &&
                                      (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                     (iVar25 = boost::multiprecision::backends::
                                               cpp_dec_float<200U,_int,_void>::compare
                                                         (pcVar35,&result_2.m_backend), -1 < iVar25)
                                     ) goto LAB_0056b798;
                                  pnVar36 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).up.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pcVar34 = &pnVar36[lVar20].m_backend;
                                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                                  result_2.m_backend.prec_elem = 0x1c;
                                  result_2.m_backend.data._M_elems[0] = 0;
                                  result_2.m_backend.data._M_elems[1] = 0;
                                  result_2.m_backend.data._M_elems[2] = 0;
                                  result_2.m_backend.data._M_elems[3] = 0;
                                  result_2.m_backend.data._M_elems[4] = 0;
                                  result_2.m_backend.data._M_elems[5] = 0;
                                  result_2.m_backend.data._M_elems[6] = 0;
                                  result_2.m_backend.data._M_elems[7] = 0;
                                  result_2.m_backend.data._M_elems[8] = 0;
                                  result_2.m_backend.data._M_elems[9] = 0;
                                  result_2.m_backend.data._M_elems[10] = 0;
                                  result_2.m_backend.data._M_elems[0xb] = 0;
                                  result_2.m_backend.data._M_elems[0xc] = 0;
                                  result_2.m_backend.data._M_elems[0xd] = 0;
                                  result_2.m_backend.data._M_elems[0xe] = 0;
                                  result_2.m_backend.data._M_elems[0xf] = 0;
                                  result_2.m_backend.data._M_elems[0x10] = 0;
                                  result_2.m_backend.data._M_elems[0x11] = 0;
                                  result_2.m_backend.data._M_elems[0x12] = 0;
                                  result_2.m_backend.data._M_elems[0x13] = 0;
                                  result_2.m_backend.data._M_elems[0x14] = 0;
                                  result_2.m_backend.data._M_elems[0x15] = 0;
                                  result_2.m_backend.data._M_elems[0x16] = 0;
                                  result_2.m_backend.data._M_elems[0x17] = 0;
                                  result_2.m_backend.data._M_elems[0x18] = 0;
                                  result_2.m_backend.data._M_elems[0x19] = 0;
                                  result_2.m_backend.data._M_elems._104_5_ = 0;
                                  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result_2.m_backend.exp = 0;
                                  result_2.m_backend.neg = false;
                                  pcVar35 = &factor.m_backend;
                                  if (&result_2.m_backend != pcVar34) {
                                    pcVar42 = &result_2.m_backend;
                                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                      (pcVar42->data)._M_elems[0] = (pcVar35->data)._M_elems[0];
                                      pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                                      pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar42 + (ulong)bVar50 * -8 + 4);
                                    }
                                    result_2.m_backend.exp = factor.m_backend.exp;
                                    result_2.m_backend.neg = factor.m_backend.neg;
                                    result_2.m_backend.fpclass = factor.m_backend.fpclass;
                                    result_2.m_backend.prec_elem = factor.m_backend.prec_elem;
                                    pcVar35 = pcVar34;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  operator*=(&result_2.m_backend,pcVar35);
                                  pcVar35 = &pnVar36[lVar21].m_backend;
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  if (&result.m_backend != pcVar35) {
                                    pcVar34 = pcVar35;
                                    pcVar42 = &result.m_backend;
                                    for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                                      (pcVar42->data)._M_elems[0] = (pcVar34->data)._M_elems[0];
                                      pcVar34 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar34 + (ulong)bVar50 * -8 + 4);
                                      pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                                ((long)pcVar42 + (ulong)bVar50 * -8 + 4);
                                    }
                                    result.m_backend.exp = pcVar35->exp;
                                    result.m_backend.neg = pcVar35->neg;
                                    result.m_backend.fpclass = pcVar35->fpclass;
                                    result.m_backend.prec_elem = pcVar35->prec_elem;
                                  }
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  operator+=(&result.m_backend,&result_2.m_backend);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2d])(lp,lVar21,&result,0);
                                }
                                else {
LAB_0056b798:
                                  ::soplex::infinity::__tls_init();
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result,local_10c8);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2d])
                                            (lp,lVar21,(cpp_dec_float<200u,int,void> *)&result,0);
                                }
                              }
LAB_0056c04c:
                              remCol.data[lVar20] = true;
                              piVar38 = (this->m_stat).data + 0xe;
                              *piVar38 = *piVar38 + 1;
                              if (da_perm.data != (int *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           da_perm.data);
                              }
                              goto LAB_0056c374;
                            }
                          }
                          pcVar35 = &(lp->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).low.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar21].m_backend;
                          ::soplex::infinity::__tls_init();
                          result.m_backend.fpclass = cpp_dec_float_finite;
                          result.m_backend.prec_elem = 0x1c;
                          result.m_backend.data._M_elems[0] = 0;
                          result.m_backend.data._M_elems[1] = 0;
                          result.m_backend.data._M_elems[2] = 0;
                          result.m_backend.data._M_elems[3] = 0;
                          result.m_backend.data._M_elems[4] = 0;
                          result.m_backend.data._M_elems[5] = 0;
                          result.m_backend.data._M_elems[6] = 0;
                          result.m_backend.data._M_elems[7] = 0;
                          result.m_backend.data._M_elems[8] = 0;
                          result.m_backend.data._M_elems[9] = 0;
                          result.m_backend.data._M_elems[10] = 0;
                          result.m_backend.data._M_elems[0xb] = 0;
                          result.m_backend.data._M_elems[0xc] = 0;
                          result.m_backend.data._M_elems[0xd] = 0;
                          result.m_backend.data._M_elems[0xe] = 0;
                          result.m_backend.data._M_elems[0xf] = 0;
                          result.m_backend.data._M_elems[0x10] = 0;
                          result.m_backend.data._M_elems[0x11] = 0;
                          result.m_backend.data._M_elems[0x12] = 0;
                          result.m_backend.data._M_elems[0x13] = 0;
                          result.m_backend.data._M_elems[0x14] = 0;
                          result.m_backend.data._M_elems[0x15] = 0;
                          result.m_backend.data._M_elems[0x16] = 0;
                          result.m_backend.data._M_elems[0x17] = 0;
                          result.m_backend.data._M_elems[0x18] = 0;
                          result.m_backend.data._M_elems[0x19] = 0;
                          result.m_backend.data._M_elems._104_5_ = 0;
                          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                          result.m_backend.exp = 0;
                          result.m_backend.neg = false;
                          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                    ((cpp_dec_float<200u,int,void> *)&result,a);
                          if (((pcVar35->fpclass == cpp_dec_float_NaN) ||
                              (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
                             (iVar29 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 (pcVar35,&result.m_backend), 0 < iVar29)) {
                            pcVar35 = &(lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).up.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar21].m_backend;
                            ::soplex::infinity::__tls_init();
                            result.m_backend.fpclass = cpp_dec_float_finite;
                            result.m_backend.prec_elem = 0x1c;
                            result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems[0x18] = 0;
                            result.m_backend.data._M_elems[0x19] = 0;
                            result.m_backend.data._M_elems._104_5_ = 0;
                            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                            result.m_backend.exp = 0;
                            result.m_backend.neg = false;
                            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                      ((cpp_dec_float<200u,int,void> *)&result,local_10c8);
                            if (((pcVar35->fpclass != cpp_dec_float_NaN) &&
                                (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                               (iVar29 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (pcVar35,&result.m_backend), -1 < iVar29)) {
                              if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0056a1ae:
                                if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                  iVar29 = boost::multiprecision::backends::
                                           cpp_dec_float<200U,_int,_void>::compare
                                                     (&factor.m_backend,&result.m_backend);
                                  if ((0 < iVar29) &&
                                     (result_4.m_backend.fpclass != cpp_dec_float_NaN)) {
                                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>
                                    ::cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                    iVar29 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (&result_4.m_backend,&result.m_backend);
                                    if (iVar29 < 0) {
                                      pcVar35 = &(lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                                 m_backend;
                                      ::soplex::infinity::__tls_init();
                                      result.m_backend.fpclass = cpp_dec_float_finite;
                                      result.m_backend.prec_elem = 0x1c;
                                      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                      result.m_backend.data._M_elems[0x18] = 0;
                                      result.m_backend.data._M_elems[0x19] = 0;
                                      result.m_backend.data._M_elems._104_5_ = 0;
                                      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                      result.m_backend.exp = 0;
                                      result.m_backend.neg = false;
                                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>
                                      ::operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                      if (((pcVar35->fpclass != cpp_dec_float_NaN) &&
                                          (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                         (iVar29 = boost::multiprecision::backends::
                                                   cpp_dec_float<200U,_int,_void>::compare
                                                             (pcVar35,&result.m_backend), iVar29 < 1
                                         )) goto LAB_0056c57d;
                                      pnVar36 = (lp->
                                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).low.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start;
                                      pFVar18 = (FixBoundsPS *)operator_new(0x30);
                                      pnVar33 = pnVar36 + lVar20;
                                      pnVar37 = &local_918;
                                      for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                                        (pnVar37->m_backend).data._M_elems[0] =
                                             (pnVar33->m_backend).data._M_elems[0];
                                        pnVar33 = (pointer)((long)pnVar33 +
                                                           ((ulong)bVar50 * -2 + 1) * 4);
                                        pnVar37 = (
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                                      }
                                      local_918.m_backend.exp = pnVar36[lVar20].m_backend.exp;
                                      local_918.m_backend.neg = pnVar36[lVar20].m_backend.neg;
                                      local_918.m_backend.fpclass =
                                           pnVar36[lVar20].m_backend.fpclass;
                                      local_918.m_backend.prec_elem =
                                           pnVar36[lVar20].m_backend.prec_elem;
                                      local_fe8.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = (this->
                                                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                )._tolerances.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr;
                                      local_fe8.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi =
                                           (this->
                                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                                      if (local_fe8.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          (local_fe8.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_fe8.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          (local_fe8.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_fe8.
                                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                        }
                                      }
                                      FixBoundsPS::FixBoundsPS
                                                (pFVar18,lp,iVar25,&local_918,&local_fe8);
                                      result.m_backend.data._M_elems._0_8_ = pFVar18;
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                 (result.m_backend.data._M_elems + 2),pFVar18);
                                      if (local_fe8.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(local_fe8.
                                                                                                      
                                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                      }
                                      std::
                                      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                      ::push_back(&this_00->data,(value_type *)&result);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x2d])
                                                (lp,lVar20,
                                                 (lp->
                                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 ).low.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar20,
                                                 0);
                                      goto joined_r0x0056c114;
                                    }
                                  }
                                }
                              }
                              else {
                                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar29 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&factor.m_backend,&result.m_backend);
                                if ((-1 < iVar29) ||
                                   (result_4.m_backend.fpclass == cpp_dec_float_NaN))
                                goto LAB_0056a1ae;
                                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar29 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&result_4.m_backend,&result.m_backend);
                                if (iVar29 < 1) goto LAB_0056a1ae;
                                pcVar35 = &(lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                           m_backend;
                                ::soplex::infinity::__tls_init();
                                result.m_backend.fpclass = cpp_dec_float_finite;
                                result.m_backend.prec_elem = 0x1c;
                                result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                result.m_backend.data._M_elems[0x18] = 0;
                                result.m_backend.data._M_elems[0x19] = 0;
                                result.m_backend.data._M_elems._104_5_ = 0;
                                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result.m_backend.exp = 0;
                                result.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                operator=((cpp_dec_float<200u,int,void> *)&result,local_10c8);
                                if (((pcVar35->fpclass != cpp_dec_float_NaN) &&
                                    (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                   (iVar29 = boost::multiprecision::backends::
                                             cpp_dec_float<200U,_int,_void>::compare
                                                       (pcVar35,&result.m_backend), -1 < iVar29))
                                goto LAB_0056c57d;
                                pnVar36 = (lp->
                                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).up.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                                pFVar18 = (FixBoundsPS *)operator_new(0x30);
                                pnVar33 = pnVar36 + lVar20;
                                pnVar37 = &local_898;
                                for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                                  (pnVar37->m_backend).data._M_elems[0] =
                                       (pnVar33->m_backend).data._M_elems[0];
                                  pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar50 * -2 + 1) * 4);
                                  pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                                }
                                local_898.m_backend.exp = pnVar36[lVar20].m_backend.exp;
                                local_898.m_backend.neg = pnVar36[lVar20].m_backend.neg;
                                local_898.m_backend.fpclass = pnVar36[lVar20].m_backend.fpclass;
                                local_898.m_backend.prec_elem = pnVar36[lVar20].m_backend.prec_elem;
                                local_fd8.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         )._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_fd8.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     (this->
                                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                                if (local_fd8.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_fd8.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_fd8.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_fd8.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_fd8.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                                FixBoundsPS::FixBoundsPS(pFVar18,lp,iVar25,&local_898,&local_fd8);
                                result.m_backend.data._M_elems._0_8_ = pFVar18;
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                           (result.m_backend.data._M_elems + 2),pFVar18);
                                if (local_fd8.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_fd8.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                }
                                std::
                                vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                ::push_back(&this_00->data,(value_type *)&result);
                                (*(lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._vptr_ClassArray[0x2a])
                                          (lp,lVar20,
                                           (lp->
                                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).up.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
joined_r0x0056c114:
                                p_Var43 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          result.m_backend.data._M_elems._8_8_;
                                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    result.m_backend.data._M_elems._8_8_ !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                goto LAB_0056c1b0;
                              }
                            }
                          }
                          else if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0056a36f:
                            if (factor.m_backend.fpclass != cpp_dec_float_NaN) {
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                              iVar29 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 (&factor.m_backend,&result.m_backend);
                              if ((iVar29 < 0) && (result_4.m_backend.fpclass != cpp_dec_float_NaN))
                              {
                                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                                iVar29 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (&result_4.m_backend,&result.m_backend);
                                if (iVar29 < 0) {
                                  pcVar35 = &(lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).low.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar20].
                                             m_backend;
                                  ::soplex::infinity::__tls_init();
                                  result.m_backend.fpclass = cpp_dec_float_finite;
                                  result.m_backend.prec_elem = 0x1c;
                                  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                                  result.m_backend.data._M_elems[0x18] = 0;
                                  result.m_backend.data._M_elems[0x19] = 0;
                                  result.m_backend.data._M_elems._104_5_ = 0;
                                  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                  result.m_backend.exp = 0;
                                  result.m_backend.neg = false;
                                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::
                                  operator=((cpp_dec_float<200u,int,void> *)&result,a);
                                  if (((pcVar35->fpclass != cpp_dec_float_NaN) &&
                                      (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                                     (iVar29 = boost::multiprecision::backends::
                                               cpp_dec_float<200U,_int,_void>::compare
                                                         (pcVar35,&result.m_backend), iVar29 < 1))
                                  goto LAB_0056c57d;
                                  pnVar36 = (lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).low.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  pFVar18 = (FixBoundsPS *)operator_new(0x30);
                                  pnVar33 = pnVar36 + lVar20;
                                  pnVar37 = &local_818;
                                  for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                                    (pnVar37->m_backend).data._M_elems[0] =
                                         (pnVar33->m_backend).data._M_elems[0];
                                    pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar50 * -2 + 1) * 4
                                                       );
                                    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                                  }
                                  local_818.m_backend.exp = pnVar36[lVar20].m_backend.exp;
                                  local_818.m_backend.neg = pnVar36[lVar20].m_backend.neg;
                                  local_818.m_backend.fpclass = pnVar36[lVar20].m_backend.fpclass;
                                  local_818.m_backend.prec_elem =
                                       pnVar36[lVar20].m_backend.prec_elem;
                                  local_fc8.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (this->
                                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            )._tolerances.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr;
                                  local_fc8.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi =
                                       (this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                                  if (local_fc8.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      (local_fc8.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_use_count =
                                           (local_fc8.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      (local_fc8.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_use_count =
                                           (local_fc8.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 1;
                                    }
                                  }
                                  FixBoundsPS::FixBoundsPS(pFVar18,lp,iVar25,&local_818,&local_fc8);
                                  result.m_backend.data._M_elems._0_8_ = pFVar18;
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                             (result.m_backend.data._M_elems + 2),pFVar18);
                                  if (local_fc8.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_fc8.
                                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
                                  }
                                  std::
                                  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                  ::push_back(&this_00->data,(value_type *)&result);
                                  (*(lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .
                                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._vptr_ClassArray[0x2d])
                                            (lp,lVar20,
                                             (lp->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).low.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
                                  goto joined_r0x0056c114;
                                }
                              }
                            }
                          }
                          else {
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                            iVar29 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>
                                     ::compare(&factor.m_backend,&result.m_backend);
                            if ((iVar29 < 1) || (result_4.m_backend.fpclass == cpp_dec_float_NaN))
                            goto LAB_0056a36f;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<long_long>(&result.m_backend,0,(type *)0x0);
                            iVar29 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>
                                     ::compare(&result_4.m_backend,&result.m_backend);
                            if (iVar29 < 1) goto LAB_0056a36f;
                            pcVar35 = &(lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).up.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
                            ::soplex::infinity::__tls_init();
                            result.m_backend.fpclass = cpp_dec_float_finite;
                            result.m_backend.prec_elem = 0x1c;
                            result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
                            result.m_backend.data._M_elems[0x18] = 0;
                            result.m_backend.data._M_elems[0x19] = 0;
                            result.m_backend.data._M_elems._104_5_ = 0;
                            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                            result.m_backend.exp = 0;
                            result.m_backend.neg = false;
                            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                      ((cpp_dec_float<200u,int,void> *)&result,local_10c8);
                            if (((pcVar35->fpclass != cpp_dec_float_NaN) &&
                                (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
                               (iVar29 = boost::multiprecision::backends::
                                         cpp_dec_float<200U,_int,_void>::compare
                                                   (pcVar35,&result.m_backend), -1 < iVar29)) {
LAB_0056c57d:
                              if (bVar24) goto LAB_0056c5b3;
                              goto LAB_0056c564;
                            }
                            pnVar36 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).up.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            pFVar18 = (FixBoundsPS *)operator_new(0x30);
                            pnVar33 = pnVar36 + lVar20;
                            pnVar37 = &local_798;
                            for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                              (pnVar37->m_backend).data._M_elems[0] =
                                   (pnVar33->m_backend).data._M_elems[0];
                              pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar50 * -2 + 1) * 4);
                              pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                            }
                            local_798.m_backend.exp = pnVar36[lVar20].m_backend.exp;
                            local_798.m_backend.neg = pnVar36[lVar20].m_backend.neg;
                            local_798.m_backend.fpclass = pnVar36[lVar20].m_backend.fpclass;
                            local_798.m_backend.prec_elem = pnVar36[lVar20].m_backend.prec_elem;
                            local_fb8.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (this->
                                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            local_fb8.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi =
                                 (this->
                                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi;
                            if (local_fb8.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                (local_fb8.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (local_fb8.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                (local_fb8.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (local_fb8.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                              }
                            }
                            FixBoundsPS::FixBoundsPS(pFVar18,lp,iVar25,&local_798,&local_fb8);
                            result.m_backend.data._M_elems._0_8_ = pFVar18;
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                            __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                       (result.m_backend.data._M_elems + 2),pFVar18);
                            if (local_fb8.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_fb8.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                            }
                            std::
                            vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                            ::push_back(&this_00->data,(value_type *)&result);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x2a])
                                      (lp,lVar20,
                                       (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).up.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20,0);
                            p_Var43 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      result.m_backend.data._M_elems._8_8_;
                            if (result.m_backend.data._M_elems._8_8_ == 0) goto LAB_0056c1b5;
LAB_0056c1b0:
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var43);
                          }
LAB_0056c1b5:
                          pnVar36 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).low.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar20;
                          piVar38 = local_4a8;
                          for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                            *piVar38 = *(int *)&(pnVar36->m_backend).data;
                            pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar50 * -2 + 1) * 4);
                            piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                          }
                          pnVar36 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).up.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pnVar33 = pnVar36 + lVar20;
                          puVar39 = local_518;
                          for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                            *puVar39 = (pnVar33->m_backend).data._M_elems[0];
                            pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar50 * -2 + 1) * 4);
                            puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                          }
                          iVar25 = pnVar36[lVar20].m_backend.exp;
                          bVar3 = pnVar36[lVar20].m_backend.neg;
                          uVar2._0_4_ = pnVar36[lVar20].m_backend.fpclass;
                          uVar2._4_4_ = pnVar36[lVar20].m_backend.prec_elem;
                          feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_698,this);
                          piVar38 = local_4a8;
                          pDVar44 = &da_perm;
                          for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                            pDVar44->thesize = *piVar38;
                            piVar38 = piVar38 + (ulong)bVar50 * -2 + 1;
                            pDVar44 = (DataArray<int> *)((long)pDVar44 + (ulong)bVar50 * -8 + 4);
                          }
                          puVar39 = local_518;
                          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&perm;
                          for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                            (pnVar37->m_backend).data._M_elems[0] = *puVar39;
                            puVar39 = puVar39 + (ulong)bVar50 * -2 + 1;
                            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                          }
                          local_da8 = iVar25;
                          local_da4 = bVar3;
                          _local_da0 = uVar2;
                          relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                    (&result_2,(soplex *)&da_perm,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&perm,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)0x0);
                          pnVar37 = &result_2;
                          pcVar35 = &result.m_backend;
                          for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                            (pcVar35->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
                            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)pnVar37 + ((ulong)bVar50 * -2 + 1) * 4);
                            pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                                      ((long)pcVar35 + (ulong)bVar50 * -8 + 4);
                          }
                          result.m_backend.exp = result_2.m_backend.exp;
                          result.m_backend.neg = result_2.m_backend.neg;
                          result.m_backend.fpclass = result_2.m_backend.fpclass;
                          result.m_backend.prec_elem = result_2.m_backend.prec_elem;
                          if ((result_2.m_backend.neg == true) &&
                             (result.m_backend.data._M_elems[0] != 0 ||
                              result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                            result.m_backend.neg = false;
                          }
                          if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                              (local_698.fpclass != cpp_dec_float_NaN)) &&
                             (iVar25 = boost::multiprecision::backends::
                                       cpp_dec_float<200U,_int,_void>::compare
                                                 (&result.m_backend,&local_698), iVar25 < 1)) {
                            remCol.data[lVar20] = true;
                            fixAndRemCol.data[lVar20] = true;
                            piVar38 = (this->m_stat).data + 0xd;
                            *piVar38 = *piVar38 + 1;
                          }
                        }
                      }
                    }
LAB_0056c374:
                    lVar48 = lVar48 + 1;
                    pDVar22 = (this->m_dupCols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar27;
                    lVar28 = lVar28 + 0x84;
                  } while (lVar48 < (pDVar22->
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).memused);
                }
                local_1038 = local_1038 + 1;
                lVar48 = (long)(this->m_dupCols).data.
                               super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar27].
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .memused;
                bVar24 = local_1038 < lVar48;
              } while (local_1038 < lVar48);
            }
          }
LAB_0056c564:
          lVar27 = lVar27 + 1;
          lVar48 = (long)(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
          bVar47 = lVar27 < lVar48;
        } while (lVar27 < lVar48);
      }
LAB_0056c5b3:
      RVar13 = UNBOUNDED;
      if (!bVar47) {
        uVar26 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        uVar49 = (ulong)uVar26;
        if (0 < (int)uVar26) {
          lVar27 = 0;
          do {
            if (fixAndRemCol.data[lVar27] == true) {
              fixColumn(this,lp,(int)lVar27,false);
            }
            lVar27 = lVar27 + 1;
            uVar49 = (ulong)(lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum;
          } while (lVar27 < (long)uVar49);
        }
        perm = (int *)0x0;
        iVar25 = (int)uVar49;
        spx_alloc<int*>(&perm,iVar25);
        uVar49 = uVar49 & 0xffffffff;
        if (iVar25 < 1) {
          uVar26 = 0;
          iVar29 = 0;
        }
        else {
          pIVar6 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          pDVar7 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey;
          uVar45 = 0;
          iVar29 = 0;
          uVar26 = 0;
          do {
            if (remCol.data[uVar45] == true) {
              perm[uVar45] = -1;
              uVar26 = uVar26 + 1;
              iVar29 = iVar29 + pIVar6[pDVar7[uVar45].idx].data.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused;
            }
            else {
              perm[uVar45] = 0;
            }
            uVar45 = uVar45 + 1;
          } while (uVar49 != uVar45);
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x17])(lp,perm);
        if (0 < iVar25) {
          piVar38 = (this->m_cIdx).data;
          uVar45 = 0;
          do {
            if (-1 < (long)perm[uVar45]) {
              piVar38[perm[uVar45]] = piVar38[uVar45];
            }
            uVar45 = uVar45 + 1;
          } while (uVar49 != uVar45);
        }
        da_perm.data = (int *)0x0;
        da_perm.memFactor = 1.2;
        da_perm.thesize = 0;
        if (0 < iVar25) {
          da_perm.thesize = iVar25;
        }
        da_perm.themax = 1;
        if (0 < iVar25) {
          da_perm.themax = da_perm.thesize;
        }
        spx_alloc<int*>(&da_perm.data,da_perm.themax);
        if (0 < iVar25) {
          uVar45 = 0;
          do {
            da_perm.data[uVar45] = perm[uVar45];
            uVar45 = uVar45 + 1;
          } while (uVar49 != uVar45);
        }
        if ((local_10b8 & 1) != 0) {
          pDVar16 = (DuplicateColsPS *)operator_new(0x2d0);
          local_b8.m_backend.fpclass = cpp_dec_float_finite;
          local_b8.m_backend.prec_elem = 0x1c;
          local_b8.m_backend.data._M_elems[0] = 0;
          local_b8.m_backend.data._M_elems[1] = 0;
          local_b8.m_backend.data._M_elems[2] = 0;
          local_b8.m_backend.data._M_elems[3] = 0;
          local_b8.m_backend.data._M_elems[4] = 0;
          local_b8.m_backend.data._M_elems[5] = 0;
          local_b8.m_backend.data._M_elems[6] = 0;
          local_b8.m_backend.data._M_elems[7] = 0;
          local_b8.m_backend.data._M_elems[8] = 0;
          local_b8.m_backend.data._M_elems[9] = 0;
          local_b8.m_backend.data._M_elems[10] = 0;
          local_b8.m_backend.data._M_elems[0xb] = 0;
          local_b8.m_backend.data._M_elems[0xc] = 0;
          local_b8.m_backend.data._M_elems[0xd] = 0;
          local_b8.m_backend.data._M_elems[0xe] = 0;
          local_b8.m_backend.data._M_elems[0xf] = 0;
          local_b8.m_backend.data._M_elems[0x10] = 0;
          local_b8.m_backend.data._M_elems[0x11] = 0;
          local_b8.m_backend.data._M_elems[0x12] = 0;
          local_b8.m_backend.data._M_elems[0x13] = 0;
          local_b8.m_backend.data._M_elems[0x14] = 0;
          local_b8.m_backend.data._M_elems[0x15] = 0;
          local_b8.m_backend.data._M_elems[0x16] = 0;
          local_b8.m_backend.data._M_elems[0x17] = 0;
          local_b8.m_backend.data._M_elems[0x18] = 0;
          local_b8.m_backend.data._M_elems[0x19] = 0;
          local_b8.m_backend.data._M_elems._104_5_ = 0;
          local_b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_b8.m_backend.exp = 0;
          local_b8.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_b8,1.0);
          DataArray<int>::DataArray(&local_e60,&da_perm);
          local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          DuplicateColsPS::DuplicateColsPS
                    (pDVar16,lp,0,0,&local_b8,&local_e60,&local_ff8,false,true);
          result.m_backend.data._M_elems._0_8_ = pDVar16;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     (result.m_backend.data._M_elems + 2),pDVar16);
          if (local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_ff8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_e60.data != (int *)0x0) {
            free(local_e60.data);
            local_e60.data = (int *)0x0;
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&(this->m_hist).data,(value_type *)&result);
          if (result.m_backend.data._M_elems._8_8_ != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       result.m_backend.data._M_elems._8_8_);
          }
        }
        free(perm);
        perm = (int *)0x0;
        if (0 < (int)uVar26) {
          piVar38 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remCols;
          *piVar38 = *piVar38 + uVar26;
          piVar38 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar38 = *piVar38 + iVar29;
          pSVar19 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          if ((pSVar19 != (SPxOut *)0x0) && (3 < (int)pSVar19->m_verbosity)) {
            result.m_backend.data._M_elems[0] = pSVar19->m_verbosity;
            result_2.m_backend.data._M_elems[0] = 4;
            (*pSVar19->_vptr_SPxOut[2])();
            pSVar19 = soplex::operator<<((this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).spxout,"Simplifier (duplicate columns) removed ");
            std::ostream::operator<<((ostream *)pSVar19->m_streams[pSVar19->m_verbosity],uVar26);
            pSVar19 = soplex::operator<<(pSVar19," cols, ");
            std::ostream::operator<<((ostream *)pSVar19->m_streams[pSVar19->m_verbosity],iVar29);
            pSVar19 = soplex::operator<<(pSVar19," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar19->m_streams[pSVar19->m_verbosity]);
            pSVar19 = (this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            (*pSVar19->_vptr_SPxOut[2])(pSVar19,&result);
          }
          result_2.m_backend.fpclass = cpp_dec_float_finite;
          result_2.m_backend.prec_elem = 0x1c;
          result_2.m_backend.data._M_elems[0] = 0;
          result_2.m_backend.data._M_elems[1] = 0;
          result_2.m_backend.data._M_elems[2] = 0;
          result_2.m_backend.data._M_elems[3] = 0;
          result_2.m_backend.data._M_elems[4] = 0;
          result_2.m_backend.data._M_elems[5] = 0;
          result_2.m_backend.data._M_elems[6] = 0;
          result_2.m_backend.data._M_elems[7] = 0;
          result_2.m_backend.data._M_elems[8] = 0;
          result_2.m_backend.data._M_elems[9] = 0;
          result_2.m_backend.data._M_elems[10] = 0;
          result_2.m_backend.data._M_elems[0xb] = 0;
          result_2.m_backend.data._M_elems[0xc] = 0;
          result_2.m_backend.data._M_elems[0xd] = 0;
          result_2.m_backend.data._M_elems[0xe] = 0;
          result_2.m_backend.data._M_elems[0xf] = 0;
          result_2.m_backend.data._M_elems[0x10] = 0;
          result_2.m_backend.data._M_elems[0x11] = 0;
          result_2.m_backend.data._M_elems[0x12] = 0;
          result_2.m_backend.data._M_elems[0x13] = 0;
          result_2.m_backend.data._M_elems[0x14] = 0;
          result_2.m_backend.data._M_elems[0x15] = 0;
          result_2.m_backend.data._M_elems[0x16] = 0;
          result_2.m_backend.data._M_elems[0x17] = 0;
          result_2.m_backend.data._M_elems[0x18] = 0;
          result_2.m_backend.data._M_elems[0x19] = 0;
          result_2.m_backend.data._M_elems._104_5_ = 0;
          result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_2.m_backend.exp = 0;
          result_2.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&result.m_backend,(long)iVar25,(type *)0x0);
          pnVar37 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_minReduction;
          if (&result_2 != pnVar37) {
            pnVar46 = &result_2;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pnVar46->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
              pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar37 + (ulong)bVar50 * -8 + 4);
              pnVar46 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar46 + ((ulong)bVar50 * -2 + 1) * 4);
            }
            result_2.m_backend.exp =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.exp;
            result_2.m_backend.neg =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.neg;
            result_2.m_backend.fpclass =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.fpclass;
            result_2.m_backend.prec_elem =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result_2.m_backend,&result.m_backend);
          if (result_2.m_backend.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&result.m_backend,(ulong)uVar26,(type *)0x0);
            iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_2.m_backend,&result.m_backend);
            if (iVar25 < 0) {
              *again = true;
            }
          }
        }
        if (da_perm.data != (int *)0x0) {
          free(da_perm.data);
          da_perm.data = (int *)0x0;
        }
        RVar13 = OKAY;
      }
      if (m_perm_empty.data != (int *)0x0) {
        free(m_perm_empty.data);
        m_perm_empty.data = (int *)0x0;
      }
      if (fixAndRemCol.data != (bool *)0x0) {
        free(fixAndRemCol.data);
        fixAndRemCol.data = (bool *)0x0;
      }
      if (remCol.data != (bool *)0x0) {
        free(remCol.data);
        remCol.data = (bool *)0x0;
      }
      if (scale.data.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (classSize.data != (int *)0x0) {
        free(classSize.data);
        classSize.data = (int *)0x0;
      }
      if (pClass.data != (int *)0x0) {
        free(pClass.data);
      }
    }
  }
  return RVar13;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}